

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_command_buffer_init(nk_command_buffer *cb,nk_buffer *b,nk_command_clipping clip)

{
  nk_command_clipping clip_local;
  nk_buffer *b_local;
  nk_command_buffer *cb_local;
  
  if (cb == (nk_command_buffer *)0x0) {
    __assert_fail("cb",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x21ce,
                  "void nk_command_buffer_init(struct nk_command_buffer *, struct nk_buffer *, enum nk_command_clipping)"
                 );
  }
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x21cf,
                  "void nk_command_buffer_init(struct nk_command_buffer *, struct nk_buffer *, enum nk_command_clipping)"
                 );
  }
  if ((cb != (nk_command_buffer *)0x0) && (b != (nk_buffer *)0x0)) {
    cb->base = b;
    cb->use_clipping = clip;
    cb->begin = b->allocated;
    cb->end = b->allocated;
    cb->last = b->allocated;
  }
  return;
}

Assistant:

NK_LIB void
nk_command_buffer_init(struct nk_command_buffer *cb,
    struct nk_buffer *b, enum nk_command_clipping clip)
{
    NK_ASSERT(cb);
    NK_ASSERT(b);
    if (!cb || !b) return;
    cb->base = b;
    cb->use_clipping = (int)clip;
    cb->begin = b->allocated;
    cb->end = b->allocated;
    cb->last = b->allocated;
}